

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,TableRef *ref)

{
  _Head_base<0UL,_duckdb::SampleOptions_*,_false> __p;
  optional_ptr<duckdb::CommonTableExpressionInfo,_true> cte;
  pointer pBVar1;
  InternalException *this_00;
  TableRef *in_RDX;
  undefined1 local_68 [32];
  string local_48;
  
  switch(in_RDX->type) {
  case BASE_TABLE:
    TableRef::Cast<duckdb::BaseTableRef>(in_RDX);
    Bind((Binder *)local_68,(BaseTableRef *)ref);
    break;
  case SUBQUERY:
    cte.ptr = (CommonTableExpressionInfo *)TableRef::Cast<duckdb::SubqueryRef>(in_RDX);
    Bind((Binder *)local_68,(SubqueryRef *)ref,cte);
    break;
  case JOIN:
    TableRef::Cast<duckdb::JoinRef>(in_RDX);
    Bind((Binder *)local_68,(JoinRef *)ref);
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Unknown table ref type (%s)","");
    EnumUtil::ToString<duckdb::TableReferenceType>(&local_48,in_RDX->type);
    InternalException::InternalException<std::__cxx11::string>(this_00,(string *)local_68,&local_48)
    ;
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case TABLE_FUNCTION:
    TableRef::Cast<duckdb::TableFunctionRef>(in_RDX);
    Bind((Binder *)local_68,(TableFunctionRef *)ref);
    break;
  case EXPRESSION_LIST:
    TableRef::Cast<duckdb::ExpressionListRef>(in_RDX);
    Bind((Binder *)local_68,(ExpressionListRef *)ref);
    break;
  case EMPTY_FROM:
    TableRef::Cast<duckdb::EmptyTableRef>(in_RDX);
    Bind((Binder *)local_68,(EmptyTableRef *)ref);
    break;
  case PIVOT:
    TableRef::Cast<duckdb::PivotRef>(in_RDX);
    Bind((Binder *)local_68,(PivotRef *)ref);
    break;
  case SHOW_REF:
    TableRef::Cast<duckdb::ShowRef>(in_RDX);
    Bind((Binder *)local_68,(ShowRef *)ref);
    break;
  case COLUMN_DATA:
    TableRef::Cast<duckdb::ColumnDataRef>(in_RDX);
    Bind((Binder *)local_68,(ColumnDataRef *)ref);
    break;
  case DELIM_GET:
    Bind((Binder *)local_68,(DelimGetRef *)ref);
  }
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68._0_8_;
  pBVar1 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
           operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                       *)this);
  __p._M_head_impl =
       (in_RDX->sample).
       super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
       super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
       super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
  (in_RDX->sample).
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
  ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::reset
            ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &pBVar1->sample,__p._M_head_impl);
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(TableRef &ref) {
	unique_ptr<BoundTableRef> result;
	switch (ref.type) {
	case TableReferenceType::BASE_TABLE:
		result = Bind(ref.Cast<BaseTableRef>());
		break;
	case TableReferenceType::JOIN:
		result = Bind(ref.Cast<JoinRef>());
		break;
	case TableReferenceType::SUBQUERY:
		result = Bind(ref.Cast<SubqueryRef>());
		break;
	case TableReferenceType::EMPTY_FROM:
		result = Bind(ref.Cast<EmptyTableRef>());
		break;
	case TableReferenceType::TABLE_FUNCTION:
		result = Bind(ref.Cast<TableFunctionRef>());
		break;
	case TableReferenceType::EXPRESSION_LIST:
		result = Bind(ref.Cast<ExpressionListRef>());
		break;
	case TableReferenceType::COLUMN_DATA:
		result = Bind(ref.Cast<ColumnDataRef>());
		break;
	case TableReferenceType::PIVOT:
		result = Bind(ref.Cast<PivotRef>());
		break;
	case TableReferenceType::SHOW_REF:
		result = Bind(ref.Cast<ShowRef>());
		break;
	case TableReferenceType::DELIM_GET:
		result = Bind(ref.Cast<DelimGetRef>());
		break;
	case TableReferenceType::CTE:
	case TableReferenceType::INVALID:
	default:
		throw InternalException("Unknown table ref type (%s)", EnumUtil::ToString(ref.type));
	}
	result->sample = std::move(ref.sample);
	return result;
}